

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O3

void lm_trie_quant_train(lm_trie_quant_t *quant,int order,uint32 counts,ngram_raw_t *raw_ngrams)

{
  float32 *values;
  float32 *values_00;
  long lVar1;
  ulong n_elem;
  long lVar2;
  
  n_elem = (ulong)counts;
  values = (float32 *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x10c);
  values_00 = (float32 *)
              __ckd_calloc__(n_elem,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                             ,0x10d);
  if (counts == 0) {
    lVar2 = 0;
  }
  else {
    lVar1 = 0;
    lVar2 = 0;
    do {
      values[lVar2] = *(float32 *)((long)&raw_ngrams->prob + lVar1);
      values_00[lVar2] = *(float32 *)((long)&raw_ngrams->backoff + lVar1);
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x18;
    } while (n_elem * 0x18 != lVar1);
  }
  make_bins(values,(uint32)lVar2,quant->tables[(long)order + -2][0].begin,
            (uint32)(1L << (quant->prob_bits & 0x3f)));
  make_bins(values_00,(uint32)lVar2,quant->tables[(long)order + -2][1].begin,
            (uint32)(1L << (quant->bo_bits & 0x3f)));
  ckd_free(values);
  ckd_free(values_00);
  return;
}

Assistant:

void
lm_trie_quant_train(lm_trie_quant_t * quant, int order, uint32 counts,
                    ngram_raw_t * raw_ngrams)
{
    float32 *probs;
    float32 *backoffs;
    float32 *centers;
    uint32 backoff_num;
    uint32 prob_num;
    ngram_raw_t *raw_ngrams_end;

    probs = (float32 *) ckd_calloc(counts, sizeof(*probs));
    backoffs = (float32 *) ckd_calloc(counts, sizeof(*backoffs));
    raw_ngrams_end = raw_ngrams + counts;

    for (backoff_num = 0, prob_num = 0; raw_ngrams != raw_ngrams_end;
         raw_ngrams++) {
        probs[prob_num++] = raw_ngrams->prob;
        backoffs[backoff_num++] = raw_ngrams->backoff;
    }

    make_bins(probs, prob_num, quant->tables[order - 2][0].begin,
              1ULL << quant->prob_bits);
    centers = quant->tables[order - 2][1].begin;
    make_bins(backoffs, backoff_num, centers, (1ULL << quant->bo_bits));
    ckd_free(probs);
    ckd_free(backoffs);
}